

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.hh
# Opt level: O0

void __thiscall QPDFObjectHandle::ParserCallbacks::ParserCallbacks(ParserCallbacks *this)

{
  ParserCallbacks *this_local;
  
  this->_vptr_ParserCallbacks = (_func_int **)&PTR__ParserCallbacks_0058e938;
  return;
}

Assistant:

class QPDF_DLL_CLASS ParserCallbacks
    {
      public:
        virtual ~ParserCallbacks() = default;
        // One of the handleObject methods must be overridden.
        QPDF_DLL
        virtual void handleObject(QPDFObjectHandle);
        QPDF_DLL
        virtual void handleObject(QPDFObjectHandle, size_t offset, size_t length);

        virtual void handleEOF() = 0;

        // Override this if you want to know the full size of the contents, possibly after
        // concatenation of multiple streams. This is called before the first call to handleObject.
        QPDF_DLL
        virtual void contentSize(size_t);

      protected:
        // Implementors may call this method during parsing to terminate parsing early. This method
        // throws an exception that is caught by parsePageContents, so its effect is immediate.
        QPDF_DLL
        void terminateParsing();
    }